

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio.c
# Opt level: O0

size_t fwrite(void *__ptr,size_t __size,size_t __n,FILE *__s)

{
  int iVar1;
  ulong local_40;
  size_t i;
  uchar *b;
  FILE *stream_local;
  size_t count_local;
  size_t size_local;
  void *buffer_local;
  
  if ((__n == 0) || (__size == 0)) {
    buffer_local = (void *)0x0;
  }
  else {
    for (local_40 = 0; buffer_local = (void *)__n, local_40 < __n; local_40 = local_40 + 1) {
      iVar1 = _Write((FILE *)__s,(void *)((long)__ptr + local_40 * __size),__size);
      if (iVar1 < 0) {
        return local_40;
      }
    }
  }
  return (size_t)buffer_local;
}

Assistant:

size_t fwrite(const void *restrict buffer, size_t size, size_t count, FILE *restrict stream) {
    if (count == 0 || size == 0) {
        return 0;
    }

    const unsigned char *const b = buffer;
    for (size_t i = 0; i < count; ++i) {
        if (_Write(stream, b + i * size, size) < 0) {
            return i;
        }
    }

    return count;
}